

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O2

csc * form_KKT(csc *P,csc *A,c_int format,c_float param1,c_float *param2,c_int *PtoKKT,c_int *AtoKKT
              ,c_int **Pdiag_idx,c_int *Pdiag_n,c_int *param2toKKT)

{
  double dVar1;
  long lVar2;
  c_int *pcVar3;
  c_int *pcVar4;
  c_float *pcVar5;
  long lVar6;
  csc *T;
  c_int *pcVar7;
  long lVar8;
  csc *pcVar9;
  long lVar10;
  long lVar11;
  c_int cVar12;
  long lVar13;
  
  lVar13 = A->m + P->m;
  T = csc_spalloc(lVar13,lVar13,P->p[P->n] + lVar13 + A->p[A->n],1,1);
  if (T == (csc *)0x0) {
LAB_00109d90:
    pcVar9 = (csc *)0x0;
  }
  else {
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar7 = (c_int *)malloc(P->m << 3);
      *Pdiag_idx = pcVar7;
      *Pdiag_n = 0;
    }
    lVar11 = 0;
    lVar13 = 0;
    while (lVar8 = lVar13, lVar8 < P->n) {
      pcVar7 = P->p;
      lVar10 = pcVar7[lVar8];
      if (lVar10 == pcVar7[lVar8 + 1]) {
        T->i[lVar11] = lVar8;
        T->p[lVar11] = lVar8;
        T->x[lVar11] = param1;
        lVar11 = lVar11 + 1;
        lVar10 = pcVar7[lVar8];
      }
      lVar13 = lVar8 + 1;
      lVar6 = lVar11;
      while (lVar11 = lVar6, lVar10 < pcVar7[lVar13]) {
        lVar2 = P->i[lVar10];
        pcVar3 = T->i;
        pcVar3[lVar11] = lVar2;
        pcVar4 = T->p;
        pcVar4[lVar11] = lVar8;
        dVar1 = P->x[lVar10];
        pcVar5 = T->x;
        pcVar5[lVar11] = dVar1;
        if (PtoKKT != (c_int *)0x0) {
          PtoKKT[lVar10] = lVar11;
        }
        if ((lVar2 == lVar8) && (pcVar5[lVar11] = dVar1 + param1, Pdiag_idx != (c_int **)0x0)) {
          (*Pdiag_idx)[*Pdiag_n] = lVar10;
          *Pdiag_n = *Pdiag_n + 1;
        }
        lVar10 = lVar10 + 1;
        lVar6 = lVar11 + 1;
        if ((lVar2 < lVar8) && (lVar10 == pcVar7[lVar13])) {
          pcVar3[lVar11 + 1] = lVar8;
          pcVar4[lVar11 + 1] = lVar8;
          pcVar5[lVar11 + 1] = param1;
          lVar6 = lVar11 + 2;
        }
      }
    }
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar7 = (c_int *)realloc(*Pdiag_idx,*Pdiag_n << 3);
      *Pdiag_idx = pcVar7;
    }
    lVar13 = 0;
    while (lVar8 = lVar13, lVar8 < A->n) {
      pcVar7 = A->p;
      for (cVar12 = pcVar7[lVar8]; lVar13 = lVar8 + 1, cVar12 < pcVar7[lVar8 + 1];
          cVar12 = cVar12 + 1) {
        T->p[lVar11] = A->i[cVar12] + P->m;
        T->i[lVar11] = lVar8;
        T->x[lVar11] = A->x[cVar12];
        if (AtoKKT != (c_int *)0x0) {
          AtoKKT[cVar12] = lVar11;
        }
        lVar11 = lVar11 + 1;
      }
    }
    for (lVar13 = 0; lVar13 < A->m; lVar13 = lVar13 + 1) {
      T->i[lVar11] = P->n + lVar13;
      T->p[lVar11] = P->n + lVar13;
      T->x[lVar11] = -param2[lVar13];
      if (param2toKKT != (c_int *)0x0) {
        param2toKKT[lVar13] = lVar11;
      }
      lVar11 = lVar11 + 1;
    }
    T->nz = lVar11;
    if ((PtoKKT == (c_int *)0x0 && AtoKKT == (c_int *)0x0) && param2toKKT == (c_int *)0x0) {
      if (format == 0) {
        pcVar9 = triplet_to_csc(T,(c_int *)0x0);
      }
      else {
        pcVar9 = triplet_to_csr(T,(c_int *)0x0);
      }
    }
    else {
      pcVar7 = (c_int *)malloc(lVar11 << 3);
      if (pcVar7 == (c_int *)0x0) {
        csc_spfree(T);
        free(*Pdiag_idx);
        goto LAB_00109d90;
      }
      if (format == 0) {
        pcVar9 = triplet_to_csc(T,pcVar7);
      }
      else {
        pcVar9 = triplet_to_csr(T,pcVar7);
      }
      if (PtoKKT != (c_int *)0x0) {
        pcVar3 = P->p;
        for (lVar13 = 0; lVar13 < pcVar3[P->n]; lVar13 = lVar13 + 1) {
          PtoKKT[lVar13] = pcVar7[PtoKKT[lVar13]];
        }
      }
      if (AtoKKT != (c_int *)0x0) {
        pcVar3 = A->p;
        for (lVar13 = 0; lVar13 < pcVar3[A->n]; lVar13 = lVar13 + 1) {
          AtoKKT[lVar13] = pcVar7[AtoKKT[lVar13]];
        }
      }
      if (param2toKKT != (c_int *)0x0) {
        for (lVar13 = 0; lVar13 < A->m; lVar13 = lVar13 + 1) {
          param2toKKT[lVar13] = pcVar7[param2toKKT[lVar13]];
        }
      }
      free(pcVar7);
    }
    csc_spfree(T);
  }
  return pcVar9;
}

Assistant:

csc* form_KKT(const csc  *P,
              const  csc *A,
              c_int       format,
              c_float     param1,
              c_float    *param2,
              c_int      *PtoKKT,
              c_int      *AtoKKT,
              c_int     **Pdiag_idx,
              c_int      *Pdiag_n,
              c_int      *param2toKKT) {
  c_int  nKKT, nnzKKTmax; // Size, number of nonzeros and max number of nonzeros
                          // in KKT matrix
  csc   *KKT_trip, *KKT;  // KKT matrix in triplet format and CSC format
  c_int  ptr, i, j;       // Counters for elements (i,j) and index pointer
  c_int  zKKT = 0;        // Counter for total number of elements in P and in
                          // KKT
  c_int *KKT_TtoC;        // Pointer to vector mapping from KKT in triplet form
                          // to CSC

  // Get matrix dimensions
  nKKT = P->m + A->m;

  // Get maximum number of nonzero elements (only upper triangular part)
  nnzKKTmax = P->p[P->n] + // Number of elements in P
              P->m +       // Number of elements in param1 * I
              A->p[A->n] + // Number of nonzeros in A
              A->m;        // Number of elements in - diag(param2)

  // Preallocate KKT matrix in triplet format
  KKT_trip = csc_spalloc(nKKT, nKKT, nnzKKTmax, 1, 1);

  if (!KKT_trip) return OSQP_NULL;  // Failed to preallocate matrix

  // Allocate vector of indices on the diagonal. Worst case it has m elements
  if (Pdiag_idx != OSQP_NULL) {
    (*Pdiag_idx) = c_malloc(P->m * sizeof(c_int));
    *Pdiag_n     = 0; // Set 0 diagonal elements to start
  }

  // Allocate Triplet matrices
  // P + param1 I
  for (j = 0; j < P->n; j++) { // cycle over columns
    // No elements in column j => add diagonal element param1
    if (P->p[j] == P->p[j + 1]) {
      KKT_trip->i[zKKT] = j;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = param1;
      zKKT++;
    }

    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // cycle over rows
      // Get current row
      i = P->i[ptr];

      // Add element of P
      KKT_trip->i[zKKT] = i;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = P->x[ptr];

      if (PtoKKT != OSQP_NULL) PtoKKT[ptr] = zKKT;  // Update index from P to
                                                    // KKTtrip

      if (i == j) {                                 // P has a diagonal element,
                                                    // add param1
        KKT_trip->x[zKKT] += param1;

        // If index vector pointer supplied -> Store the index
        if (Pdiag_idx != OSQP_NULL) {
          (*Pdiag_idx)[*Pdiag_n] = ptr;
          (*Pdiag_n)++;
        }
      }
      zKKT++;

      // Add diagonal param1 in case
      if ((i < j) &&                  // Diagonal element not reached
          (ptr + 1 == P->p[j + 1])) { // last element of column j
        // Add diagonal element param1
        KKT_trip->i[zKKT] = j;
        KKT_trip->p[zKKT] = j;
        KKT_trip->x[zKKT] = param1;
        zKKT++;
      }
    }
  }

  if (Pdiag_idx != OSQP_NULL) {
    // Realloc Pdiag_idx so that it contains exactly *Pdiag_n diagonal elements
    (*Pdiag_idx) = c_realloc((*Pdiag_idx), (*Pdiag_n) * sizeof(c_int));
  }


  // A' at top right
  for (j = 0; j < A->n; j++) {                      // Cycle over columns of A
    for (ptr = A->p[j]; ptr < A->p[j + 1]; ptr++) {
      KKT_trip->p[zKKT] = P->m + A->i[ptr];         // Assign column index from
                                                    // row index of A
      KKT_trip->i[zKKT] = j;                        // Assign row index from
                                                    // column index of A
      KKT_trip->x[zKKT] = A->x[ptr];                // Assign A value element

      if (AtoKKT != OSQP_NULL) AtoKKT[ptr] = zKKT;  // Update index from A to
                                                    // KKTtrip
      zKKT++;
    }
  }

  // - diag(param2) at bottom right
  for (j = 0; j < A->m; j++) {
    KKT_trip->i[zKKT] = j + P->n;
    KKT_trip->p[zKKT] = j + P->n;
    KKT_trip->x[zKKT] = -param2[j];

    if (param2toKKT != OSQP_NULL) param2toKKT[j] = zKKT;  // Update index from
                                                          // param2 to KKTtrip
    zKKT++;
  }

  // Allocate number of nonzeros
  KKT_trip->nz = zKKT;

  // Convert triplet matrix to csc format
  if (!PtoKKT && !AtoKKT && !param2toKKT) {
    // If no index vectors passed, do not store KKT mapping from Trip to CSC/CSR
    if (format == 0) KKT = triplet_to_csc(KKT_trip, OSQP_NULL);
    else KKT = triplet_to_csr(KKT_trip, OSQP_NULL);
  }
  else {
    // Allocate vector of indices from triplet to csc
    KKT_TtoC = c_malloc((zKKT) * sizeof(c_int));

    if (!KKT_TtoC) {
      // Error in allocating KKT_TtoC vector
      csc_spfree(KKT_trip);
      c_free(*Pdiag_idx);
      return OSQP_NULL;
    }

    // Store KKT mapping from Trip to CSC/CSR
    if (format == 0)
      KKT = triplet_to_csc(KKT_trip, KKT_TtoC);
    else
      KKT = triplet_to_csr(KKT_trip, KKT_TtoC);

    // Update vectors of indices from P, A, param2 to KKT (now in CSC format)
    if (PtoKKT != OSQP_NULL) {
      for (i = 0; i < P->p[P->n]; i++) {
        PtoKKT[i] = KKT_TtoC[PtoKKT[i]];
      }
    }

    if (AtoKKT != OSQP_NULL) {
      for (i = 0; i < A->p[A->n]; i++) {
        AtoKKT[i] = KKT_TtoC[AtoKKT[i]];
      }
    }

    if (param2toKKT != OSQP_NULL) {
      for (i = 0; i < A->m; i++) {
        param2toKKT[i] = KKT_TtoC[param2toKKT[i]];
      }
    }

    // Free mapping
    c_free(KKT_TtoC);
  }

  // Clean matrix in triplet format and return result
  csc_spfree(KKT_trip);

  return KKT;
}